

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::testCaseEnded(ConsoleReporter *this,TestCaseStats *_testCaseStats)

{
  pointer this_00;
  StreamingReporterBase<Catch::ConsoleReporter> *in_RSI;
  TestCaseStats *in_RDI;
  StreamingReporterBase<Catch::ConsoleReporter> *this_01;
  
  this_01 = in_RSI;
  this_00 = clara::std::unique_ptr<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>::
            operator->((unique_ptr<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_> *
                       )0x31d843);
  TablePrinter::close(this_00,(int)in_RSI);
  StreamingReporterBase<Catch::ConsoleReporter>::testCaseEnded(this_01,in_RDI);
  in_RDI[1].testInfo.className.field_2._M_local_buf[8] = '\0';
  return;
}

Assistant:

void ConsoleReporter::testCaseEnded(TestCaseStats const& _testCaseStats) {
    m_tablePrinter->close();
    StreamingReporterBase::testCaseEnded(_testCaseStats);
    m_headerPrinted = false;
}